

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benmark2.cpp
# Opt level: O0

void onConnect(int fd)

{
  size_type __n;
  ulong uVar1;
  size_type sVar2;
  reference ppTVar3;
  element_type *peVar4;
  undefined1 local_120 [16];
  anon_class_16_1_8989fd51 local_110;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> local_100;
  undefined1 local_e0 [16];
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> local_d0;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  local_b0;
  undefined1 local_90 [32];
  undefined1 local_70 [8];
  Ptr sc;
  ThreadPool *t;
  Ptr buff;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string msg;
  int fd_local;
  
  msg.field_2._12_4_ = fd;
  printf("onConnect\n");
  __n = (size_type)packetSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,__n,'a',&local_31);
  std::allocator<char>::~allocator(&local_31);
  hwnet::Buffer::New((Buffer *)&t,(string *)local_30);
  uVar1 = (ulong)(int)msg.field_2._12_4_;
  sVar2 = std::vector<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>::size(&pools);
  ppTVar3 = std::vector<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>::operator[]
                      (&pools,uVar1 % sVar2);
  sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppTVar3;
  hwnet::TCPSocket::New
            ((TCPSocket *)local_70,&poller_,
             (ThreadPool *)
             sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             msg.field_2._12_4_);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  std::
  function<void(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)>
  ::
  function<void(&)(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long),void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)>
              *)&local_b0,onDataClient);
  hwnet::TCPSocket::SetRecvCallback((TCPSocket *)local_90,(RecvCallback *)peVar4);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_90);
  std::function<void(std::shared_ptr<hwnet::TCPSocket>const&,int)>::
  function<void(&)(std::shared_ptr<hwnet::TCPSocket>const&,int),void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&,int)> *)(local_e0 + 0x10),
             onError);
  hwnet::TCPSocket::SetErrorCallback((TCPSocket *)(local_90 + 0x10),(ErrorCallback *)peVar4);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)(local_90 + 0x10));
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)(local_e0 + 0x10));
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_90);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::~function(&local_b0);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  std::shared_ptr<hwnet::Buffer>::shared_ptr(&local_110.buff,(shared_ptr<hwnet::Buffer> *)&t);
  std::function<void(std::shared_ptr<hwnet::TCPSocket>const&)>::function<onConnect(int)::__0,void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&)> *)&local_100,&local_110);
  hwnet::TCPSocket::SetFlushCallback((TCPSocket *)local_e0,(FlushCallback *)peVar4);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_e0);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function(&local_100);
  onConnect(int)::$_0::~__0((__0 *)&local_110);
  std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_70);
  hwnet::TCPSocket::Start((TCPSocket *)local_120);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_120);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  hwnet::TCPSocket::Send(peVar4,(Ptr *)&t,0);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_70);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)&t);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect\n");
	std::string msg = std::string(packetSize,'a');
	auto buff = Buffer::New(msg);
	ThreadPool *t = pools[fd%pools.size()];
	auto sc = TCPSocket::New(&poller_,t,fd);
	sc->SetRecvCallback(onDataClient)->SetErrorCallback(onError);
	sc->SetFlushCallback([buff](const TCPSocket::Ptr &s){
		s->Recv(buff);
	});	
	sc->Start();
	sc->Send(buff);
}